

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

QStyle * QApplication::style(void)

{
  QStyle *pQVar1;
  QApplication *pQVar2;
  QString *key;
  QStringList *__range3;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QApplicationPrivate::app_style;
  if (QApplicationPrivate::app_style != (QStyle *)0x0) goto LAB_002bb3ef;
  pQVar2 = QtPrivate::qobject_cast_helper<QApplication*,QObject>(QCoreApplication::self);
  if (pQVar2 == (QApplication *)0x0) {
LAB_002bb4d5:
    pQVar1 = (QStyle *)0x0;
  }
  else {
    QApplicationPrivate::desktopStyleKey();
    QApplicationPrivate::app_style = QStyleFactory::create((QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
    if (QApplicationPrivate::app_style == (QStyle *)0x0) {
      local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      QStyleFactory::keys();
      lVar3 = local_48.size * 0x18;
      key = local_48.ptr;
      do {
        if (lVar3 == 0) break;
        QApplicationPrivate::app_style = QStyleFactory::create(key);
        key = key + 1;
        lVar3 = lVar3 + -0x18;
      } while (QApplicationPrivate::app_style == (QStyle *)0x0);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
      if (QApplicationPrivate::app_style == (QStyle *)0x0) goto LAB_002bb4d5;
    }
    pQVar2 = (QApplication *)QApplicationPrivate::app_style;
    QObject::setParent(&QApplicationPrivate::app_style->super_QObject);
    QGuiApplicationPrivate::updatePalette();
    if (QApplicationPrivate::styleSheet.d.size == 0) {
      (**(code **)(*(long *)QApplicationPrivate::app_style + 0x70))
                (QApplicationPrivate::app_style,QCoreApplication::self);
      pQVar1 = QApplicationPrivate::app_style;
    }
    else {
      setStyleSheet(pQVar2,&QApplicationPrivate::styleSheet);
      pQVar1 = QApplicationPrivate::app_style;
    }
  }
LAB_002bb3ef:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pQVar1;
}

Assistant:

QStyle *QApplication::style()
{
    if (!QApplicationPrivate::app_style) {
        // Create default style
        if (!qobject_cast<QApplication *>(QCoreApplication::instance())) {
            Q_ASSERT(!"No style available without QApplication!");
            return nullptr;
        }

        auto &defaultStyle = QApplicationPrivate::app_style;

        defaultStyle = QStyleFactory::create(QApplicationPrivate::desktopStyleKey());
        if (!defaultStyle) {
            const QStringList styles = QStyleFactory::keys();
            for (const auto &style : styles) {
                if ((defaultStyle = QStyleFactory::create(style)))
                    break;
            }
        }
        if (!defaultStyle) {
            Q_ASSERT(!"No styles available!");
            return nullptr;
        }

        // Take ownership of the style
        defaultStyle->setParent(qApp);

        QGuiApplicationPrivate::updatePalette();

#ifndef QT_NO_STYLE_STYLESHEET
        if (!QApplicationPrivate::styleSheet.isEmpty()) {
            qApp->setStyleSheet(QApplicationPrivate::styleSheet);
        } else
#endif
        {
            defaultStyle->polish(qApp);
        }
    }

    return QApplicationPrivate::app_style;
}